

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode Curl_senddata(Curl_easy *data,void *buffer,size_t buflen,ssize_t *n)

{
  CURLcode CVar1;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  sigpipe_ignore pipe_st;
  
  c = (connectdata *)0x0;
  CVar1 = easy_connection(data,&sfd,&c);
  if (CVar1 == CURLE_OK) {
    if (data->conn == (connectdata *)0x0) {
      Curl_attach_connection(data,c);
    }
    *n = 0;
    sigpipe_ignore(data,&pipe_st);
    CVar1 = Curl_write(data,sfd,buffer,buflen,&n1);
    sigpipe_restore(&pipe_st);
    if (n1 == -1) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else if (CVar1 == CURLE_OK && n1 == 0) {
      CVar1 = CURLE_AGAIN;
    }
    else {
      *n = n1;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_senddata(struct Curl_easy *data, const void *buffer,
                       size_t buflen, ssize_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;
  SIGPIPE_VARIABLE(pipe_st);

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  if(!data->conn)
    /* on first invoke, the transfer has been detached from the connection and
       needs to be reattached */
    Curl_attach_connection(data, c);

  *n = 0;
  sigpipe_ignore(data, &pipe_st);
  result = Curl_write(data, sfd, buffer, buflen, &n1);
  sigpipe_restore(&pipe_st);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = n1;

  return result;
}